

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrule.cpp
# Opt level: O3

UBool __thiscall icu_63::NFRule::operator==(NFRule *this,NFRule *rhs)

{
  ushort uVar1;
  short sVar2;
  UBool UVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  
  if (this->baseValue != rhs->baseValue) {
    return '\0';
  }
  if ((this->radix == rhs->radix) && (this->exponent == rhs->exponent)) {
    uVar1 = (this->fRuleText).fUnion.fStackFields.fLengthAndFlags;
    if ((uVar1 & 1) == 0) {
      if ((short)uVar1 < 0) {
        iVar4 = (this->fRuleText).fUnion.fFields.fLength;
      }
      else {
        iVar4 = (int)(short)uVar1 >> 5;
      }
      sVar2 = (rhs->fRuleText).fUnion.fStackFields.fLengthAndFlags;
      if (sVar2 < 0) {
        iVar5 = (rhs->fRuleText).fUnion.fFields.fLength;
      }
      else {
        iVar5 = (int)sVar2 >> 5;
      }
      if (((int)sVar2 & 1U) != 0) {
        return '\0';
      }
      if (iVar4 != iVar5) {
        return '\0';
      }
      UVar3 = UnicodeString::doEquals(&this->fRuleText,&rhs->fRuleText,iVar4);
      bVar6 = UVar3 != '\0';
    }
    else {
      bVar6 = (bool)(*(byte *)&(rhs->fRuleText).fUnion & 1);
    }
    if (bVar6 != false) {
      if (this->sub1 == (NFSubstitution *)0x0) {
        if (rhs->sub1 != (NFSubstitution *)0x0) {
          return '\0';
        }
      }
      else {
        if (rhs->sub1 == (NFSubstitution *)0x0) {
          return '\0';
        }
        iVar4 = (*(this->sub1->super_UObject)._vptr_UObject[3])();
        if ((char)iVar4 == '\0') {
          return '\0';
        }
      }
      if (this->sub2 == (NFSubstitution *)0x0) {
        if (rhs->sub2 == (NFSubstitution *)0x0) {
          return '\x01';
        }
      }
      else if (rhs->sub2 != (NFSubstitution *)0x0) {
        iVar4 = (*(this->sub2->super_UObject)._vptr_UObject[3])();
        return (char)iVar4 != '\0';
      }
    }
  }
  return '\0';
}

Assistant:

UBool
NFRule::operator==(const NFRule& rhs) const
{
    return baseValue == rhs.baseValue
        && radix == rhs.radix
        && exponent == rhs.exponent
        && fRuleText == rhs.fRuleText
        && util_equalSubstitutions(sub1, rhs.sub1)
        && util_equalSubstitutions(sub2, rhs.sub2);
}